

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

Fxu_Single * Fxu_HeapSingleGetMax(Fxu_HeapSingle *p)

{
  int iVar1;
  Fxu_Single *pSingle;
  Fxu_HeapSingle *p_local;
  
  if (p->nItems == 0) {
    p_local = (Fxu_HeapSingle *)0x0;
  }
  else {
    p_local = (Fxu_HeapSingle *)p->pTree[1];
    ((Fxu_Single *)p_local)->HNum = 0;
    iVar1 = p->nItems;
    p->nItems = iVar1 + -1;
    p->pTree[1] = p->pTree[iVar1];
    p->pTree[1]->HNum = 1;
    Fxu_HeapSingleMoveDn(p,p->pTree[1]);
  }
  return (Fxu_Single *)p_local;
}

Assistant:

Fxu_Single * Fxu_HeapSingleGetMax( Fxu_HeapSingle * p )
{
    Fxu_Single * pSingle;
    if ( p->nItems == 0 )
        return NULL;
    // prepare the return value
    pSingle = p->pTree[1];
    pSingle->HNum = 0;
    // put the last entry on top
    // decrement the number of entries
    p->pTree[1] = p->pTree[p->nItems--];
    p->pTree[1]->HNum = 1;
    // move the top entry down if necessary
    Fxu_HeapSingleMoveDn( p, p->pTree[1] );
    return pSingle;     
}